

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O1

void lm_trie_fix_counts(ngram_raw_t **raw_ngrams,uint32 *counts,uint32 *fixed_counts,int order)

{
  uint uVar1;
  ngram_raw_t *pnVar2;
  void *__src;
  undefined8 uVar3;
  long lVar4;
  uint uVar5;
  priority_queue_t *queue;
  undefined8 *element;
  size_t sVar6;
  long *ptr;
  ulong uVar7;
  ulong uVar8;
  uint32 words [5];
  uint32 raw_ngram_ptrs [4];
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  uint32 *local_50;
  uint auStack_48 [6];
  
  queue = priority_queue_create((long)(order + -1),ngram_ord_comparator);
  local_68 = 0xffffffffffffffff;
  uStack_60 = 0xffffffff;
  uStack_5c = 0xffffffff;
  local_58 = 0xffffffff;
  local_50 = fixed_counts;
  memcpy(fixed_counts,counts,(long)order * 4);
  if (1 < order) {
    uVar8 = 2;
    do {
      if (counts[uVar8 - 1] != 0) {
        auStack_48[uVar8 - 2] = 0;
        element = (undefined8 *)
                  __ckd_calloc__(1,0x18,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                 ,0xca);
        pnVar2 = raw_ngrams[uVar8 - 2];
        element[2] = *(undefined8 *)&pnVar2->order;
        uVar3 = *(undefined8 *)&pnVar2->prob;
        *element = pnVar2->words;
        element[1] = uVar3;
        *(int *)(element + 2) = (int)uVar8;
        priority_queue_add(queue,element);
      }
      uVar8 = uVar8 + 1;
    } while (order + 1 != uVar8);
  }
  do {
    sVar6 = priority_queue_size(queue);
    if (sVar6 == 0) break;
    ptr = (long *)priority_queue_poll(queue);
    if ((int)ptr[2] == 2) {
      local_68 = *(undefined8 *)*ptr;
    }
    else {
      uVar5 = (int)ptr[2] - 1;
      uVar8 = (ulong)uVar5;
      if (uVar5 != 0) {
        __src = (void *)*ptr;
        uVar7 = 0;
        do {
          if (*(int *)((long)&local_68 + uVar7 * 4) != *(int *)((long)__src + uVar7 * 4)) {
            uVar8 = uVar7 & 0xffffffff;
            if ((uint)uVar7 < 2) {
              uVar8 = 1;
            }
            memcpy(&local_68,__src,uVar8 * 4 + 4);
            local_50[uVar8] = local_50[uVar8] + 1;
            uVar8 = (ulong)((int)ptr[2] - 1);
            *(undefined4 *)((long)&local_68 + uVar8 * 4) = *(undefined4 *)((long)__src + uVar8 * 4);
            goto LAB_00110f61;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      *(undefined4 *)((long)&local_68 + uVar8 * 4) = *(undefined4 *)(*ptr + uVar8 * 4);
    }
    auStack_48[(int)ptr[2] - 2] = auStack_48[(int)ptr[2] - 2] + 1;
LAB_00110f61:
    uVar5 = (int)ptr[2] - 2;
    uVar1 = auStack_48[uVar5];
    if (uVar1 < counts[(int)ptr[2] - 1]) {
      pnVar2 = raw_ngrams[uVar5];
      ptr[2] = *(long *)&pnVar2[uVar1].order;
      pnVar2 = pnVar2 + uVar1;
      lVar4 = *(long *)&pnVar2->prob;
      *ptr = (long)pnVar2->words;
      ptr[1] = lVar4;
      priority_queue_add(queue,ptr);
    }
    else {
      ckd_free(ptr);
    }
  } while (sVar6 != 0);
  sVar6 = priority_queue_size(queue);
  if (sVar6 != 0) {
    __assert_fail("priority_queue_size(ngrams) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                  ,0xf4,"void lm_trie_fix_counts(ngram_raw_t **, uint32 *, uint32 *, int)");
  }
  priority_queue_free(queue,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

void
lm_trie_fix_counts(ngram_raw_t ** raw_ngrams, uint32 * counts,
                   uint32 * fixed_counts, int order)
{
    priority_queue_t *ngrams =
        priority_queue_create(order - 1, &ngram_ord_comparator);
    uint32 raw_ngram_ptrs[NGRAM_MAX_ORDER - 1];
    uint32 words[NGRAM_MAX_ORDER];
    int i;

    memset(words, -1, sizeof(words));
    memcpy(fixed_counts, counts, order * sizeof(*fixed_counts));
    for (i = 2; i <= order; i++) {
        ngram_raw_t *tmp_ngram;
        
        if (counts[i - 1] <= 0)
            continue;

        raw_ngram_ptrs[i - 2] = 0;

        tmp_ngram =
            (ngram_raw_t *) ckd_calloc(1, sizeof(*tmp_ngram));
        *tmp_ngram = raw_ngrams[i - 2][0];
        tmp_ngram->order = i;
        priority_queue_add(ngrams, tmp_ngram);
    }

    for (;;) {
        int32 to_increment = TRUE;
        ngram_raw_t *top;
        if (priority_queue_size(ngrams) == 0) {
            break;
        }
        top = (ngram_raw_t *) priority_queue_poll(ngrams);
        if (top->order == 2) {
            memcpy(words, top->words, 2 * sizeof(*words));
        }
        else {
            for (i = 0; (uint32)i < top->order - 1; i++) {
                if (words[i] != top->words[i]) {
                    int num;
                    num = (i == 0) ? 1 : i;
                    memcpy(words, top->words,
                           (num + 1) * sizeof(*words));
                    fixed_counts[num]++;
                    to_increment = FALSE;
                    break;
                }
            }
            words[top->order - 1] = top->words[top->order - 1];
        }
        if (to_increment) {
            raw_ngram_ptrs[top->order - 2]++;
        }
        if (raw_ngram_ptrs[top->order - 2] < counts[top->order - 1]) {
            *top = raw_ngrams[top->order - 2][raw_ngram_ptrs[top->order - 2]];
            priority_queue_add(ngrams, top);
        }
        else {
            ckd_free(top);
        }
    }

    assert(priority_queue_size(ngrams) == 0);
    priority_queue_free(ngrams, NULL);
}